

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.c
# Opt level: O2

int64_t aom_highbd_sse_c(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  lVar4 = (long)a8 * 2;
  lVar2 = (long)b8 * 2;
  uVar1 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar1;
  }
  if (height < 1) {
    height = 0;
  }
  for (iVar6 = 0; iVar6 != height; iVar6 = iVar6 + 1) {
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      iVar3 = (uint)*(ushort *)(lVar4 + uVar7 * 2) - (uint)*(ushort *)(lVar2 + uVar7 * 2);
      uVar1 = uVar1 + (uint)(iVar3 * iVar3);
    }
    lVar2 = lVar2 + (long)b_stride * 2;
    lVar4 = lVar4 + (long)a_stride * 2;
  }
  return uVar1;
}

Assistant:

int64_t aom_highbd_sse_c(const uint8_t *a8, int a_stride, const uint8_t *b8,
                         int b_stride, int width, int height) {
  int y, x;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int32_t diff = (int32_t)(a[x]) - (int32_t)(b[x]);
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}